

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_emit_yaml(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  csubstr sp;
  bool bVar5;
  error_flags eVar6;
  int iVar7;
  csubstr *pcVar8;
  size_t sVar9;
  Callbacks *pCVar10;
  NodeScalar *pNVar11;
  NodeData *pNVar12;
  undefined8 in_RSI;
  Tree *in_RDI;
  char msg_2 [13];
  char msg_1 [35];
  char msg [42];
  size_t child;
  anon_class_24_3_fd5fe6d2 write_tag_directives;
  TagDirective *etd;
  TagDirective *btd;
  size_t ilevel;
  anon_class_8_1_8991fb9c dispatch;
  undefined7 in_stack_fffffffffffffc58;
  char in_stack_fffffffffffffc5f;
  Tree *in_stack_fffffffffffffc60;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc68;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  Location *in_stack_fffffffffffffc80;
  Location *this_00;
  size_t in_stack_fffffffffffffc98;
  anon_class_24_3_fd5fe6d2 *in_stack_fffffffffffffca0;
  Tree *this_01;
  size_t in_stack_fffffffffffffca8;
  Tree *in_stack_fffffffffffffcb0;
  Tree *in_stack_fffffffffffffcb8;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  size_t local_2f0;
  undefined1 local_2e5 [45];
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  size_t local_2a0;
  char local_298 [24];
  size_t in_stack_fffffffffffffd80;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd88;
  undefined8 local_270;
  Tree *pTStack_268;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  anon_class_8_1_8991fb9c *paStack_258;
  char *local_250;
  char local_248 [48];
  size_t local_218;
  tag_directive_const_iterator *local_210;
  tag_directive_const_iterator local_208;
  TagDirectiveProxy local_1f8;
  tag_directive_const_iterator local_1e8;
  TagDirectiveProxy local_1e0;
  tag_directive_const_iterator local_1d0;
  char *local_1c8;
  size_t local_1c0;
  long local_1b8;
  NodeType_e local_1b0 [2];
  undefined8 local_1a0;
  undefined8 local_190;
  Tree *local_188;
  NodeData *local_180;
  undefined8 local_178;
  Tree *local_170;
  undefined8 local_168;
  Tree *local_160;
  undefined8 local_158;
  Tree *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  NodeType_e *local_138;
  undefined8 local_130;
  Tree *local_128;
  undefined8 local_120;
  Tree *local_118;
  undefined8 local_110;
  Tree *local_108;
  undefined8 local_100;
  Tree *local_f8;
  undefined8 local_f0;
  Tree *local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  NodeData *local_d0;
  NodeData *local_c8;
  NodeData *local_c0;
  NodeData *local_b8;
  NodeData *local_b0;
  NodeData *local_a8;
  NodeData *local_a0;
  NodeData *local_98;
  size_t in_stack_ffffffffffffff78;
  size_t __n;
  size_t in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  undefined1 local_60 [8];
  size_t local_58;
  undefined8 local_50;
  void *local_40;
  undefined1 *local_38;
  undefined1 local_30 [8];
  size_t local_28;
  undefined8 local_20;
  void *local_10;
  undefined1 *local_8;
  NodeScalar *pNVar13;
  
  local_1a0 = in_RSI;
  bVar5 = Tree::is_root(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if (!bVar5) {
    local_150 = (Tree *)in_RDI->m_size;
    local_158 = local_1a0;
    local_d0 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    bVar5 = false;
    if (((local_d0->m_type).type & (STREAM|MAP)) != NOTYPE) {
      local_1b0[0] = (NodeType_e)
                     Tree::type((Tree *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58
                                                ),0x28a990);
      local_138 = local_1b0;
      bVar5 = (local_1b0[0] & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE;
    }
    if (bVar5) {
      local_1b8 = 0;
      local_128 = (Tree *)in_RDI->m_size;
      local_130 = local_1a0;
      local_b8 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      if (((local_b8->m_type).type & KEY) != NOTYPE) {
        pcVar8 = Tree::key(in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
        local_1c8 = pcVar8->str;
        local_1c0 = pcVar8->len;
        sp.len = (size_t)in_stack_fffffffffffffc78;
        sp.str = (char *)in_stack_fffffffffffffc70;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffc68,sp);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffc60,
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
        local_1b8 = local_1b8 + 1;
      }
      _do_visit_block_container
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
      return;
    }
  }
  local_1e0 = Tree::tag_directives(in_stack_fffffffffffffc60);
  local_1d0 = local_1e0.b;
  local_1f8 = Tree::tag_directives(in_stack_fffffffffffffc60);
  local_1e8 = local_1f8.e;
  local_210 = &local_1d0;
  local_208 = local_1f8.e;
  local_188 = (Tree *)in_RDI->m_size;
  local_190 = local_1a0;
  local_180 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if (((local_180->m_type).type & STREAM) == STREAM) {
    sVar9 = Tree::first_child(in_stack_fffffffffffffc60,
                              CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    if (sVar9 != 0xffffffffffffffff) {
      Tree::first_child(in_stack_fffffffffffffc60,
                        CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      _emit_yaml::anon_class_24_3_fd5fe6d2::operator()
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    }
    local_218 = Tree::first_child(in_stack_fffffffffffffc60,
                                  CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    while (local_218 != 0xffffffffffffffff) {
      _emit_yaml::anon_class_8_1_8991fb9c::operator()
                (in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
      sVar9 = Tree::next_sibling(in_stack_fffffffffffffc60,
                                 CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      if (sVar9 != 0xffffffffffffffff) {
        Tree::next_sibling(in_stack_fffffffffffffc60,
                           CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
        _emit_yaml::anon_class_24_3_fd5fe6d2::operator()
                  (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      }
      local_218 = Tree::next_sibling(in_stack_fffffffffffffc60,
                                     CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    }
  }
  else {
    local_160 = (Tree *)in_RDI->m_size;
    local_168 = local_1a0;
    local_c8 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    if (((local_c8->m_type).type & (STREAM|MAP)) == NOTYPE) {
      local_118 = (Tree *)in_RDI->m_size;
      local_120 = local_1a0;
      local_b0 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      if (((local_b0->m_type).type & DOC) == NOTYPE) {
        local_e8 = (Tree *)in_RDI->m_size;
        local_f0 = local_1a0;
        local_98 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        if (((local_98->m_type).type & KEYVAL) == KEYVAL) {
          __n = 0;
          this_01 = in_RDI;
          pNVar11 = Tree::keysc(in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
          pNVar12 = Tree::_p(in_stack_fffffffffffffcb0,(size_t)pNVar11);
          _write((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_01,(int)pNVar11,
                 (void *)((pNVar12->m_type).type & (_WIP_KEY_STYLE|KEYQUO|KEYANCH|KEYREF|KEY)),__n);
          WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffc60,
                     (char (*) [3])CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
          local_20 = local_1a0;
          local_28 = 0;
          pNVar13 = Tree::valsc(in_stack_fffffffffffffcb8,(size_t)in_RDI);
          iVar7 = (int)pNVar13;
          pNVar12 = Tree::_p(in_RDI,(size_t)pNVar11);
          local_10 = (void *)((pNVar12->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL));
          local_8 = local_30;
          _write((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI,iVar7,local_10,local_28);
          local_2e5._29_8_ =
               Tree::type((Tree *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                          0x28b20d);
          local_140 = local_2e5 + 0x1d;
          if ((local_2e5._29_8_ & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE) {
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5f);
          }
        }
        else {
          local_108 = (Tree *)in_RDI->m_size;
          local_110 = local_1a0;
          local_a0 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          if (((local_a0->m_type).type & KEYVAL) == VAL) {
            local_50 = local_1a0;
            local_58 = 0;
            pNVar11 = Tree::valsc(in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
            iVar7 = (int)pNVar11;
            pNVar12 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
            local_40 = (void *)((pNVar12->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL))
            ;
            local_38 = local_60;
            _write((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI,iVar7,local_40,local_58);
            local_2e5._21_8_ =
                 Tree::type((Tree *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                            0x28b38a);
            local_148 = local_2e5 + 0x15;
            if ((local_2e5._21_8_ & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE) {
              WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5f);
            }
          }
          else {
            local_2e5._13_8_ =
                 Tree::type((Tree *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                            0x28b3f2);
            local_d8 = local_2e5 + 0xd;
            local_e0 = 0;
            if (local_2e5._13_8_ != NOTYPE) {
              local_2e5._0_8_ = 0x206e776f6e6b6e75;
              local_2e5._8_4_ = 0x65707974;
              local_2e5[0xc] = 0;
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                trap_instruction();
              }
              pCVar10 = Tree::callbacks((Tree *)in_RDI->m_size);
              p_Var1 = pCVar10->m_error;
              this_00 = (Location *)local_2e5;
              Location::Location(this_00,in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70
                                 ,(size_t)in_stack_fffffffffffffc68,
                                 (size_t)in_stack_fffffffffffffc60);
              pCVar10 = Tree::callbacks((Tree *)in_RDI->m_size);
              LVar4.super_LineCol.line = uStack_308;
              LVar4.super_LineCol.offset = local_310;
              LVar4.super_LineCol.col = local_300;
              LVar4.name.str = (char *)uStack_2f8;
              LVar4.name.len = local_2f0;
              (*p_Var1)((char *)this_00,0xd,LVar4,pCVar10->m_user_data);
            }
          }
        }
      }
      else {
        local_170 = (Tree *)in_RDI->m_size;
        local_178 = local_1a0;
        local_c0 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        if (((local_c0->m_type).type & (STREAM|MAP)) != NOTYPE) {
          memcpy(local_248,"check failed: (!m_tree->is_container(id))",0x2a);
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            trap_instruction();
          }
          pCVar10 = Tree::callbacks((Tree *)in_RDI->m_size);
          p_Var1 = pCVar10->m_error;
          Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                             (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                             (size_t)in_stack_fffffffffffffc60);
          pCVar10 = Tree::callbacks((Tree *)in_RDI->m_size);
          LVar2.super_LineCol.line = (size_t)pTStack_268;
          LVar2.super_LineCol.offset = local_270;
          LVar2.super_LineCol.col = (size_t)local_260;
          LVar2.name.str = (char *)paStack_258;
          LVar2.name.len = (size_t)local_250;
          (*p_Var1)(local_248,0x2a,LVar2,pCVar10->m_user_data);
          in_stack_fffffffffffffc60 = pTStack_268;
          in_stack_fffffffffffffc68 = local_260;
          in_stack_fffffffffffffc70 = paStack_258;
          in_stack_fffffffffffffc78 = local_250;
        }
        local_f8 = (Tree *)in_RDI->m_size;
        local_100 = local_1a0;
        local_a8 = Tree::_p(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        if (((local_a8->m_type).type & KEYVAL) != VAL) {
          memcpy(local_298,"check failed: (m_tree->is_val(id))",0x23);
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            trap_instruction();
          }
          pCVar10 = Tree::callbacks((Tree *)in_RDI->m_size);
          p_Var1 = pCVar10->m_error;
          Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                             (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                             (size_t)in_stack_fffffffffffffc60);
          pCVar10 = Tree::callbacks((Tree *)in_RDI->m_size);
          LVar3.super_LineCol.line = uStack_2b8;
          LVar3.super_LineCol.offset = local_2e5._37_8_;
          LVar3.super_LineCol.col = local_2b0;
          LVar3.name.str = (char *)uStack_2a8;
          LVar3.name.len = local_2a0;
          (*p_Var1)(local_298,0x23,LVar3,pCVar10->m_user_data);
        }
        _write_doc(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      }
    }
    else {
      _emit_yaml::anon_class_8_1_8991fb9c::operator()
                (in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
    }
  }
  return;
}

Assistant:

void Emitter<Writer>::_emit_yaml(size_t id)
{
    // save branches in the visitor by doing the initial stream/doc
    // logic here, sparing the need to check stream/val/keyval inside
    // the visitor functions
    auto dispatch = [this](size_t node){
        NodeType ty = m_tree->type(node);
        if(ty.marked_flow_sl())
            _do_visit_flow_sl(node, 0);
        else if(ty.marked_flow_ml())
            _do_visit_flow_ml(node, 0);
        else
        {
            _do_visit_block(node, 0);
        }
    };
    if(!m_tree->is_root(id))
    {
        if(m_tree->is_container(id) && !m_tree->type(id).marked_flow())
        {
            size_t ilevel = 0;
            if(m_tree->has_key(id))
            {
                this->Writer::_do_write(m_tree->key(id));
                this->Writer::_do_write(":\n");
                ++ilevel;
            }
            _do_visit_block_container(id, ilevel, ilevel);
            return;
        }
    }

    auto *btd = m_tree->tag_directives().b;
    auto *etd = m_tree->tag_directives().e;
    auto write_tag_directives = [&btd, etd, this](size_t next_node){
        auto end = btd;
        while(end < etd)
        {
            if(end->next_node_id > next_node)
                break;
            ++end;
        }
        for( ; btd != end; ++btd)
        {
            if(next_node != m_tree->first_child(m_tree->parent(next_node)))
                this->Writer::_do_write("...\n");
            this->Writer::_do_write("%TAG ");
            this->Writer::_do_write(btd->handle);
            this->Writer::_do_write(' ');
            this->Writer::_do_write(btd->prefix);
            this->Writer::_do_write('\n');
        }
    };
    if(m_tree->is_stream(id))
    {
        if(m_tree->first_child(id) != NONE)
            write_tag_directives(m_tree->first_child(id));
        for(size_t child = m_tree->first_child(id); child != NONE; child = m_tree->next_sibling(child))
        {
            dispatch(child);
            if(m_tree->next_sibling(child) != NONE)
                write_tag_directives(m_tree->next_sibling(child));
        }
    }
    else if(m_tree->is_container(id))
    {
        dispatch(id);
    }
    else if(m_tree->is_doc(id))
    {
        _RYML_CB_ASSERT(m_tree->callbacks(), !m_tree->is_container(id)); // checked above
        _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_val(id)); // so it must be a val
        _write_doc(id);
    }
    else if(m_tree->is_keyval(id))
    {
        _writek(id, 0);
        this->Writer::_do_write(": ");
        _writev(id, 0);
        if(!m_tree->type(id).marked_flow())
            this->Writer::_do_write('\n');
    }
    else if(m_tree->is_val(id))
    {
        //this->Writer::_do_write("- ");
        _writev(id, 0);
        if(!m_tree->type(id).marked_flow())
            this->Writer::_do_write('\n');
    }
    else if(m_tree->type(id) == NOTYPE)
    {
        ;
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "unknown type");
    }
}